

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,LayerOffset *v)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  _anonymous_namespace_ *this;
  double dVar4;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  byte local_22;
  byte local_21;
  bool print_scale;
  LayerOffset *pLStack_20;
  bool print_offset;
  LayerOffset *v_local;
  ostream *ofs_local;
  
  local_21 = 1;
  local_22 = 1;
  dVar1 = v->_offset;
  pLStack_20 = v;
  v_local = (LayerOffset *)ofs;
  dVar4 = numeric_limits<double>::epsilon();
  if (ABS(dVar1) < dVar4) {
    local_21 = 0;
  }
  dVar1 = pLStack_20->_scale;
  dVar4 = numeric_limits<double>::epsilon();
  if (ABS(dVar1 - 1.0) < dVar4) {
    local_22 = 0;
  }
  if (((local_21 & 1) == 0) && ((local_22 & 1) == 0)) {
    ofs_local = (ostream *)v_local;
  }
  else {
    std::operator<<((ostream *)v_local,"(");
    if (((local_21 & 1) == 0) || ((local_22 & 1) == 0)) {
      if ((local_21 & 1) == 0) {
        this = (_anonymous_namespace_ *)0x5f4299;
        poVar2 = std::operator<<((ostream *)v_local,"scale = ");
        tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_a8,this,pLStack_20->_scale);
        std::operator<<(poVar2,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        pcVar3 = "offset = ";
        poVar2 = std::operator<<((ostream *)v_local,"offset = ");
        tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                  (&local_88,(_anonymous_namespace_ *)pcVar3,pLStack_20->_offset);
        std::operator<<(poVar2,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    else {
      pcVar3 = "offset = ";
      poVar2 = std::operator<<((ostream *)v_local,"offset = ");
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)pcVar3,pLStack_20->_offset);
      poVar2 = std::operator<<(poVar2,(string *)&local_48);
      pcVar3 = ", scale = ";
      poVar2 = std::operator<<(poVar2,", scale = ");
      tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
                (&local_68,(_anonymous_namespace_ *)pcVar3,pLStack_20->_scale);
      std::operator<<(poVar2,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::operator<<((ostream *)v_local,")");
    ofs_local = (ostream *)v_local;
  }
  return ofs_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::LayerOffset &v) {
  bool print_offset{true};
  bool print_scale{true};

  if (std::fabs(v._offset) < std::numeric_limits<double>::epsilon()) {
    print_offset = false;
  }

  if (std::fabs(v._scale - 1.0) < std::numeric_limits<double>::epsilon()) {
    print_scale = false;
  }

  if (!print_offset && !print_scale) {
    // No need to print LayerOffset.
    return ofs;
  }

  // TODO: Do not print scale when it is 1.0
  ofs << "(";
  if (print_offset && print_scale) {
    ofs << "offset = " << tinyusdz::dtos(v._offset)
        << ", scale = " << tinyusdz::dtos(v._scale);
  } else if (print_offset) {
    ofs << "offset = " << tinyusdz::dtos(v._offset);
  } else {  // print_scale
    ofs << "scale = " << tinyusdz::dtos(v._scale);
  }
  ofs << ")";

  return ofs;
}